

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O1

void __thiscall adios2::Transport::InitProfiler(Transport *this,Mode openMode,TimeUnit timeUnit)

{
  IOChrono *pIVar1;
  pair<const_char_*,_adios2::profiling::Timer> local_228;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  char *local_c8;
  Timer local_c0;
  
  (this->m_Profiler).m_IsActive = true;
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"open","");
  profiling::Timer::Timer(&local_c0,&local_e8,Microseconds,false);
  local_c8 = "open";
  std::pair<const_char_*,_adios2::profiling::Timer>::pair<adios2::profiling::Timer,_true>
            (&local_228,&local_c8,&local_c0);
  pIVar1 = &this->m_Profiler;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<std::pair<char_const*,adios2::profiling::Timer>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)pIVar1,&local_228);
  profiling::Timer::~Timer(&local_228.second);
  profiling::Timer::~Timer(&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (openMode == Append) {
    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"write","");
    profiling::Timer::Timer((Timer *)&local_228,&local_128,timeUnit,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[6],adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pIVar1,"write",&local_228);
    profiling::Timer::~Timer((Timer *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p);
    }
    local_228.first._0_4_ = 0;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[6],int>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&(this->m_Profiler).m_Bytes,"write");
    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"read","");
    profiling::Timer::Timer((Timer *)&local_228,&local_148,timeUnit,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[5],adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pIVar1,"read",&local_228);
    profiling::Timer::~Timer((Timer *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p);
    }
  }
  else {
    if (openMode != Read) {
      if (openMode == Write) {
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"write","");
        profiling::Timer::Timer((Timer *)&local_228,&local_108,timeUnit,false);
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const(&)[6],adios2::profiling::Timer>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)pIVar1,"write",&local_228);
        profiling::Timer::~Timer((Timer *)&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        local_228.first._0_4_ = 0;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<char_const(&)[6],int>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&(this->m_Profiler).m_Bytes,"write");
      }
      goto LAB_0063ffe4;
    }
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"read","");
    profiling::Timer::Timer((Timer *)&local_228,&local_168,timeUnit,false);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<char_const(&)[5],adios2::profiling::Timer>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)pIVar1,"read",&local_228);
    profiling::Timer::~Timer((Timer *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p);
    }
  }
  local_228.first._0_4_ = 0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[5],int>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&(this->m_Profiler).m_Bytes,"read");
LAB_0063ffe4:
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"close","");
  profiling::Timer::Timer((Timer *)&local_228,&local_188,Microseconds,false);
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_M_emplace<char_const(&)[6],adios2::profiling::Timer>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,adios2::profiling::Timer>,std::allocator<std::pair<std::__cxx11::string_const,adios2::profiling::Timer>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)pIVar1,"close",&local_228);
  profiling::Timer::~Timer((Timer *)&local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Transport::InitProfiler(const Mode openMode, const TimeUnit timeUnit)
{
    m_Profiler.m_IsActive = true;

    m_Profiler.m_Timers.emplace(
        std::make_pair("open", profiling::Timer("open", TimeUnit::Microseconds)));

    if (openMode == Mode::Write)
    {
        m_Profiler.m_Timers.emplace("write", profiling::Timer("write", timeUnit));

        m_Profiler.m_Bytes.emplace("write", 0);
    }
    else if (openMode == Mode::Append)
    {
        /*
        m_Profiler.Timers.emplace(
            "append", profiling::Timer("append", timeUnit));
        m_Profiler.Bytes.emplace("append", 0);
        */
        m_Profiler.m_Timers.emplace("write", profiling::Timer("write", timeUnit));

        m_Profiler.m_Bytes.emplace("write", 0);

        m_Profiler.m_Timers.emplace("read", profiling::Timer("read", timeUnit));

        m_Profiler.m_Bytes.emplace("read", 0);
    }
    else if (openMode == Mode::Read)
    {
        m_Profiler.m_Timers.emplace("read", profiling::Timer("read", timeUnit));
        m_Profiler.m_Bytes.emplace("read", 0);
    }

    m_Profiler.m_Timers.emplace("close", profiling::Timer("close", TimeUnit::Microseconds));
}